

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool duckdb_re2::RE2::Extract(StringPiece *text,RE2 *re,StringPiece *rewrite,string *out)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  StringPiece vec [17];
  StringPiece local_148 [17];
  
  switchD_00569a20::default(local_148,0,0x110);
  uVar3 = MaxSubmatch(rewrite);
  bVar2 = false;
  if ((uVar3 < 0x11) && (bVar2 = false, (int)uVar3 <= re->num_captures_)) {
    bVar2 = false;
    bVar1 = Match(re,text,0,text->size_,UNANCHORED,local_148,uVar3 + 1);
    if (bVar1) {
      out->_M_string_length = 0;
      *(out->_M_dataplus)._M_p = '\0';
      bVar2 = Rewrite(re,out,rewrite,local_148,uVar3 + 1);
    }
  }
  return bVar2;
}

Assistant:

bool RE2::Extract(const StringPiece& text,
                  const RE2& re,
                  const StringPiece& rewrite,
                  std::string* out) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > 1 + re.NumberOfCapturingGroups())
    return false;
  if (nvec > static_cast<int>(arraysize(vec)))
    return false;
  if (!re.Match(text, 0, text.size(), UNANCHORED, vec, nvec))
    return false;

  out->clear();
  return re.Rewrite(out, rewrite, vec, nvec);
}